

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SampledFunc::~SampledFunc(SampledFunc *this)

{
  void *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  ~SampledFunc((SampledFunc *)0x792138);
  operator_delete(in_RDI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

SampledFunc() : SystemSubroutine(KnownSystemName::Sampled, SubroutineKind::Function) {}